

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O3

uint GetFunctionVmReturnType
               (ExternFuncInfo *function,ExternTypeInfo *exTypes,ExternMemberInfo *exTypeExtra)

{
  SubCategory SVar1;
  ulong uVar2;
  
  uVar2 = (ulong)exTypeExtra[exTypes[function->funcType].field_11.subType].type;
  if ((uVar2 < 0xf) &&
     ((0x47ffU >> (exTypeExtra[exTypes[function->funcType].field_11.subType].type & 0x1f) & 1) != 0)
     ) {
    return *(uint *)(&DAT_001db41c + uVar2 * 4);
  }
  SVar1 = exTypes[uVar2].subCat;
  if ((SVar1 != CAT_POINTER) &&
     ((SVar1 != CAT_CLASS || (SVar1 = CAT_FUNCTION, exTypes[uVar2].type != TYPE_INT)))) {
    return 4;
  }
  return SVar1;
}

Assistant:

unsigned GetFunctionVmReturnType(ExternFuncInfo &function, ExternTypeInfo *exTypes, ExternMemberInfo *exTypeExtra)
{
	RegVmReturnType retType = rvrVoid;

	ExternTypeInfo &targetType = exTypes[function.funcType];

	unsigned targetReturnTypeId = exTypeExtra[targetType.memberOffset].type;
	ExternTypeInfo &targetReturnType = exTypes[targetReturnTypeId];

	switch(targetReturnTypeId)
	{
	case NULLC_TYPE_VOID:
		retType = rvrVoid;
		break;
	case NULLC_TYPE_BOOL:
	case NULLC_TYPE_CHAR:
	case NULLC_TYPE_SHORT:
	case NULLC_TYPE_INT:
		retType = rvrInt;
		break;
	case NULLC_TYPE_LONG:
		retType = rvrLong;
		break;
	case NULLC_TYPE_FLOAT:
	case NULLC_TYPE_DOUBLE:
		retType = rvrDouble;
		break;
	case NULLC_TYPE_TYPEID:
	case NULLC_TYPE_FUNCTION:
		retType = rvrInt;
		break;
	case NULLC_TYPE_NULLPTR:
	case NULLC_TYPE_VOID_REF:
		retType = NULLC_PTR_SIZE == 4 ? rvrInt : rvrLong;
		break;
	default:
		if(targetReturnType.subCat == ExternTypeInfo::CAT_POINTER)
			retType = NULLC_PTR_SIZE == 4 ? rvrInt : rvrLong;
		else if(targetReturnType.subCat == ExternTypeInfo::CAT_CLASS && targetReturnType.type == ExternTypeInfo::TYPE_INT)
			retType = rvrInt;
		else
			retType = rvrStruct;
		break;
	}

	return retType;
}